

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildStructuredCFGAnalysis(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::StructuredCFGAnalysis,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ::operator=(&this->struct_cfg_analysis_,&local_18);
  std::
  unique_ptr<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ::~unique_ptr(&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisStructuredCFG);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildStructuredCFGAnalysis() {
    struct_cfg_analysis_ = MakeUnique<StructuredCFGAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisStructuredCFG;
  }